

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoisePrintKeyCodes(void)

{
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  ushort **ppuVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 local_38;
  undefined4 uStack_34;
  char quit [4];
  char c;
  
  uStack_34 = (undefined4)((ulong)in_RAX >> 0x20);
  puts(
      "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit."
      );
  iVar2 = linenoiseEnableRawMode(0);
  if (iVar2 != -1) {
    _local_38 = CONCAT44(uStack_34,0x20202020);
    while( true ) {
      do {
        sVar3 = read(0,(void *)((long)&uStack_34 + 3),1);
      } while ((int)sVar3 < 1);
      cVar1 = uStack_34._3_1_;
      uVar6 = (uint)uStack_34._3_1_;
      local_38 = CONCAT13(cVar1,(int3)((ulong)_local_38 >> 8));
      if (local_38 == 0x74697571) break;
      ppuVar4 = __ctype_b_loc();
      uVar5 = 0x3f;
      if (((*ppuVar4)[(int)uVar6] >> 0xe & 1) != 0) {
        uVar5 = (ulong)uVar6;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",uVar5,(ulong)uVar6,(ulong)uVar6);
      putchar(0xd);
      fflush(_stdout);
    }
    if (ls.rawmode != 0) {
      iVar2 = tcsetattr(0,2,(termios *)&orig_termios);
      if (iVar2 != -1) {
        ls.rawmode = 0;
      }
    }
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
    char quit[4];

    printf("Linenoise key codes debugging mode.\n"
            "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
    if (linenoiseEnableRawMode(STDIN_FILENO) == -1) return;
    memset(quit,' ',4);
    while(1) {
        char c;
        int nread;

        nread = read(STDIN_FILENO,&c,1);
        if (nread <= 0) continue;
        memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
        quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
        if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

        printf("'%c' %02x (%d) (type quit to exit)\n",
            isprint(c) ? c : '?', (int)c, (int)c);
        printf("\r"); /* Go left edge manually, we are in raw mode. */
        fflush(stdout);
    }
    linenoiseDisableRawMode(STDIN_FILENO);
}